

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void aom_paeth_predictor_32x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])above);
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar16._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar16._16_16_ = ZEXT116(1) * auVar3;
  auVar2 = vpmovzxbw_avx(*(undefined1 (*) [16])(above + 0x10));
  auVar3 = vpunpckhbw_avx(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar17._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar2;
  auVar17._16_16_ = ZEXT116(1) * auVar3;
  bVar1 = above[-1];
  auVar18[1] = 0;
  auVar18[0] = bVar1;
  auVar18[2] = bVar1;
  auVar18[3] = 0;
  auVar18[4] = bVar1;
  auVar18[5] = 0;
  auVar18[6] = bVar1;
  auVar18[7] = 0;
  auVar18[8] = bVar1;
  auVar18[9] = 0;
  auVar18[10] = bVar1;
  auVar18[0xb] = 0;
  auVar18[0xc] = bVar1;
  auVar18[0xd] = 0;
  auVar18[0xe] = bVar1;
  auVar18[0xf] = 0;
  auVar18[0x10] = bVar1;
  auVar18[0x11] = 0;
  auVar18[0x12] = bVar1;
  auVar18[0x13] = 0;
  auVar18[0x14] = bVar1;
  auVar18[0x15] = 0;
  auVar18[0x16] = bVar1;
  auVar18[0x17] = 0;
  auVar18[0x18] = bVar1;
  auVar18[0x19] = 0;
  auVar18[0x1a] = bVar1;
  auVar18[0x1b] = 0;
  auVar18[0x1c] = bVar1;
  auVar18[0x1d] = 0;
  auVar18[0x1e] = bVar1;
  auVar18[0x1f] = 0;
  auVar10 = vpsubw_avx2(auVar16,auVar18);
  auVar4 = vpabsw_avx2(auVar10);
  auVar11 = vpsubw_avx2(auVar17,auVar18);
  auVar5 = vpabsw_avx2(auVar11);
  lVar14 = 0;
  auVar19._8_8_ = 0x8000800080008000;
  auVar19._0_8_ = 0x8000800080008000;
  auVar19._16_8_ = 0x8000800080008000;
  auVar19._24_8_ = 0x8000800080008000;
  auVar7 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
  do {
    auVar20._16_16_ = *(undefined1 (*) [16])(left + lVar14 * 0x10);
    auVar20._0_16_ = *(undefined1 (*) [16])(left + lVar14 * 0x10);
    iVar15 = 0x10;
    auVar13 = auVar19;
    do {
      auVar9 = vpshufb_avx2(auVar20,auVar13);
      auVar6 = vpaddw_avx2(auVar9,auVar10);
      auVar12 = vpsubw_avx2(auVar6,auVar16);
      auVar12 = vpabsw_avx2(auVar12);
      auVar6 = vpsubw_avx2(auVar6,auVar18);
      auVar6 = vpabsw_avx2(auVar6);
      auVar21 = vpminsw_avx2(auVar12,auVar6);
      auVar21 = vpcmpgtw_avx2(auVar4,auVar21);
      auVar12 = vpcmpgtw_avx2(auVar12,auVar6);
      auVar6 = vpandn_avx2(auVar21,auVar9);
      auVar12 = vpblendvb_avx2(auVar16,auVar18,auVar12);
      auVar12 = vpand_avx2(auVar21,auVar12);
      auVar8 = vpor_avx2(auVar6,auVar12);
      auVar6 = vpaddw_avx2(auVar9,auVar11);
      auVar12 = vpsubw_avx2(auVar6,auVar17);
      auVar12 = vpabsw_avx2(auVar12);
      auVar6 = vpsubw_avx2(auVar6,auVar18);
      auVar6 = vpabsw_avx2(auVar6);
      auVar21 = vpminsw_avx2(auVar12,auVar6);
      auVar21 = vpcmpgtw_avx2(auVar5,auVar21);
      auVar12 = vpcmpgtw_avx2(auVar12,auVar6);
      auVar6 = vpandn_avx2(auVar21,auVar9);
      auVar12 = vpblendvb_avx2(auVar17,auVar18,auVar12);
      auVar12 = vpand_avx2(auVar21,auVar12);
      auVar12 = vpor_avx2(auVar6,auVar12);
      auVar6 = vperm2i128_avx2(auVar8,auVar12,0x31);
      auVar21._0_16_ = ZEXT116(0) * auVar12._0_16_ + ZEXT116(1) * auVar8._0_16_;
      auVar21._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar12._0_16_;
      auVar12 = vpackuswb_avx2(auVar21,auVar6);
      *(undefined1 (*) [32])dst = auVar12;
      dst = *(undefined1 (*) [32])dst + stride;
      auVar13 = vpsubw_avx2(auVar13,auVar7);
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  return;
}

Assistant:

void aom_paeth_predictor_32x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i t0 = get_top_vector(above);
  const __m256i t1 = get_top_vector(above + 16);
  const __m256i tl = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);

  int i, j;
  for (j = 0; j < 4; ++j) {
    const __m256i l = get_left_vector(left + j * 16);
    __m256i rep = _mm256_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      const __m256i l16 = _mm256_shuffle_epi8(l, rep);

      const __m128i r0 = paeth_16x1_pred(&l16, &t0, &tl);
      const __m128i r1 = paeth_16x1_pred(&l16, &t1, &tl);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);

      dst += stride;
      rep = _mm256_add_epi16(rep, one);
    }
  }
}